

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidConvolutionNoPadding(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ostream *poVar3;
  Result local_a8;
  ConvolutionLayerParams *params;
  NeuralNetworkLayer *convLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out3 = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,100);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out3,100);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"probs");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  convLayer = (NeuralNetworkLayer *)
              CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  params = (ConvolutionLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)convLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"probs");
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_convolution((NeuralNetworkLayer *)params);
  CoreML::Specification::ConvolutionLayerParams::set_outputchannels
            ((ConvolutionLayerParams *)local_a8.m_message._M_storage._M_storage,5);
  CoreML::Specification::ConvolutionLayerParams::set_kernelchannels
            ((ConvolutionLayerParams *)local_a8.m_message._M_storage._M_storage,3);
  CoreML::Specification::ConvolutionLayerParams::set_hasbias
            ((ConvolutionLayerParams *)local_a8.m_message._M_storage._M_storage,false);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_a8);
  if (m1._oneof_case_[0]._0_1_) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x576);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidConvolutionNoPadding() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    shape->add_shape(100);
    shape->add_shape(100);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("probs");
    auto *params = convLayer->mutable_convolution();
    params->set_outputchannels(5);
    params->set_kernelchannels(3);

    params->set_hasbias(false);

    // not specifying a padding type should be invalid
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;

}